

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::WriteObjectsVariable
          (cmMakefileTargetGenerator *this,string *variableName,string *variableNameExternal,
          bool useWatcomQuote)

{
  cmLocalUnixMakefileGenerator3 *pcVar1;
  cmMakefile *this_00;
  pointer pbVar2;
  cmGeneratedFileStream *pcVar3;
  bool bVar4;
  string *psVar5;
  ostream *poVar6;
  cmValue suffix;
  string *psVar7;
  string *obj;
  pointer pbVar8;
  string *obj_1;
  string_view str;
  string object;
  allocator<char> local_a5;
  uint local_a4;
  string local_a0;
  string *local_80;
  string *local_78;
  string local_70;
  string local_50;
  
  pcVar1 = this->LocalGenerator;
  psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"_OBJECTS",(allocator<char> *)&local_70);
  cmLocalUnixMakefileGenerator3::CreateMakeVariable(&local_50,pcVar1,psVar5,&local_a0);
  std::__cxx11::string::operator=((string *)variableName,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_a0);
  poVar6 = std::operator<<((ostream *)
                           (this->BuildFileStream)._M_t.
                           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                           "# Object files for target ");
  psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  poVar6 = std::operator<<(poVar6,(string *)psVar5);
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,(string *)variableName);
  std::operator<<(poVar6," =");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_80 = (string *)&this->GlobalGenerator->LineContinueDirective;
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"CMAKE_PCH_EXTENSION",(allocator<char> *)&local_70);
  local_78 = variableNameExternal;
  suffix = cmMakefile::GetDefinition(this_00,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  pbVar2 = (this->Objects).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_a4 = (uint)useWatcomQuote;
  for (pbVar8 = (this->Objects).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar2; pbVar8 = pbVar8 + 1) {
    str._M_str = (pbVar8->_M_dataplus)._M_p;
    str._M_len = pbVar8->_M_string_length;
    bVar4 = cmHasSuffix(str,suffix);
    if (!bVar4) {
      poVar6 = std::operator<<((ostream *)
                               (this->BuildFileStream)._M_t.
                               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                               " ");
      std::operator<<(poVar6,local_80);
      pcVar3 = (this->BuildFileStream)._M_t.
               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
      cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath(&local_a0,pbVar8,SUB41(local_a4,0));
      std::operator<<((ostream *)pcVar3,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
  }
  std::operator<<((ostream *)
                  (this->BuildFileStream)._M_t.
                  super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                  .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,"\n");
  psVar5 = local_78;
  pcVar1 = this->LocalGenerator;
  psVar7 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"_EXTERNAL_OBJECTS",&local_a5);
  cmLocalUnixMakefileGenerator3::CreateMakeVariable(&local_a0,pcVar1,psVar7,&local_70);
  std::__cxx11::string::operator=((string *)psVar5,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_70);
  poVar6 = std::operator<<((ostream *)
                           (this->BuildFileStream)._M_t.
                           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,"\n")
  ;
  poVar6 = std::operator<<(poVar6,"# External object files for target ");
  psVar7 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  poVar6 = std::operator<<(poVar6,(string *)psVar7);
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,(string *)psVar5);
  std::operator<<(poVar6," =");
  pbVar2 = (this->ExternalObjects).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar8 = (this->ExternalObjects).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar2; pbVar8 = pbVar8 + 1) {
    cmOutputConverter::MaybeRelativeToCurBinDir
              (&local_a0,
               &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,pbVar8);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    poVar6 = std::operator<<((ostream *)
                             (this->BuildFileStream)._M_t.
                             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl," "
                            );
    std::operator<<(poVar6,local_80);
    pcVar3 = (this->BuildFileStream)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath(&local_a0,pbVar8,SUB41(local_a4,0));
    std::operator<<((ostream *)pcVar3,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  poVar6 = std::operator<<((ostream *)
                           (this->BuildFileStream)._M_t.
                           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,"\n")
  ;
  std::operator<<(poVar6,"\n");
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteObjectsVariable(
  std::string& variableName, std::string& variableNameExternal,
  bool useWatcomQuote)
{
  // Write a make variable assignment that lists all objects for the
  // target.
  variableName = this->LocalGenerator->CreateMakeVariable(
    this->GeneratorTarget->GetName(), "_OBJECTS");
  *this->BuildFileStream << "# Object files for target "
                         << this->GeneratorTarget->GetName() << "\n"
                         << variableName << " =";
  std::string object;
  const auto& lineContinue = this->GlobalGenerator->LineContinueDirective;

  cmValue pchExtension = this->Makefile->GetDefinition("CMAKE_PCH_EXTENSION");

  for (std::string const& obj : this->Objects) {
    if (cmHasSuffix(obj, pchExtension)) {
      continue;
    }
    *this->BuildFileStream << " " << lineContinue;
    *this->BuildFileStream
      << cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath(
           obj, useWatcomQuote);
  }
  *this->BuildFileStream << "\n";

  // Write a make variable assignment that lists all external objects
  // for the target.
  variableNameExternal = this->LocalGenerator->CreateMakeVariable(
    this->GeneratorTarget->GetName(), "_EXTERNAL_OBJECTS");
  /* clang-format off */
  *this->BuildFileStream
    << "\n"
    << "# External object files for target "
    << this->GeneratorTarget->GetName() << "\n"
    << variableNameExternal << " =";
  /* clang-format on */
  for (std::string const& obj : this->ExternalObjects) {
    object = this->LocalGenerator->MaybeRelativeToCurBinDir(obj);
    *this->BuildFileStream << " " << lineContinue;
    *this->BuildFileStream
      << cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath(
           obj, useWatcomQuote);
  }
  *this->BuildFileStream << "\n"
                         << "\n";
}